

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,CaseSensitive caseSensitivity)

{
  bool bVar1;
  char in_CL;
  StringRef s;
  string local_80 [48];
  string local_50 [32];
  StringRef local_30;
  CaseSensitive local_1c;
  string *psStack_18;
  CaseSensitive caseSensitivity_local;
  string *pattern_local;
  WildcardPattern *this_local;
  
  this->m_caseSensitivity = caseSensitivity;
  this->m_wildcard = NoWildcard;
  local_1c = caseSensitivity;
  psStack_18 = pattern;
  pattern_local = (string *)this;
  normaliseString(&this->m_pattern,this,pattern);
  StringRef::StringRef(&local_30,&this->m_pattern);
  s.m_size = 0x2a;
  s.m_start = (char *)local_30.m_size;
  bVar1 = startsWith((Catch *)local_30.m_start,s,in_CL);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&this->m_pattern);
    std::__cxx11::string::operator=((string *)&this->m_pattern,local_50);
    std::__cxx11::string::~string(local_50);
    this->m_wildcard = WildcardAtStart;
  }
  bVar1 = endsWith(&this->m_pattern,'*');
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_80,(ulong)&this->m_pattern);
    std::__cxx11::string::operator=((string *)&this->m_pattern,local_80);
    std::__cxx11::string::~string(local_80);
    this->m_wildcard = this->m_wildcard | WildcardAtEnd;
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }